

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap_secure.hpp
# Opt level: O2

void __thiscall
ot::commissioner::coap::CoapSecure::Connect
          (CoapSecure *this,ConnectHandler *aOnConnected,string *aPeerAddr,uint16_t aPeerPort)

{
  uint uVar1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  string_view fmt;
  function<void_(ot::commissioner::DtlsSession_&,_ot::commissioner::Error)> local_c0;
  string local_a0;
  undefined1 local_80 [40];
  pointer local_58;
  size_type sStack_50;
  ulong local_48;
  ulong local_38;
  
  uVar1 = UdpSocket::Connect((this->mSocket).
                             super___shared_ptr<ot::commissioner::UdpSocket,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr,aPeerAddr,aPeerPort);
  if ((uVar1 == 0) || ((aOnConnected->super__Function_base)._M_manager == (_Manager_type)0x0)) {
    std::function<void_(ot::commissioner::DtlsSession_&,_ot::commissioner::Error)>::function
              (&local_c0,aOnConnected);
    DtlsSession::Connect(&this->mDtlsSession,&local_c0);
    std::_Function_base::~_Function_base(&local_c0.super__Function_base);
  }
  else {
    ::fmt::v10::detail::
    check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short_&,_int_&,_FMT_COMPILE_STRING,_0>
              ();
    local_58 = (aPeerAddr->_M_dataplus)._M_p;
    sStack_50 = aPeerAddr->_M_string_length;
    local_48 = (ulong)aPeerPort;
    local_38 = (ulong)uVar1;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_58;
    fmt.size_ = 0x12d;
    fmt.data_ = (char *)0x32;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_a0,(v10 *)"connect socket to peer addr={}, port={} failed: {}",fmt,args);
    local_80._0_4_ = kIOError;
    std::__cxx11::string::string((string *)(local_80 + 8),(string *)&local_a0);
    std::function<void_(ot::commissioner::DtlsSession_&,_ot::commissioner::Error)>::operator()
              (aOnConnected,&this->mDtlsSession,(Error *)local_80);
    std::__cxx11::string::~string((string *)(local_80 + 8));
    std::__cxx11::string::~string((string *)&local_a0);
  }
  return;
}

Assistant:

void Connect(DtlsSession::ConnectHandler aOnConnected, const std::string &aPeerAddr, uint16_t aPeerPort)
    {
        if (int fail = mSocket->Connect(aPeerAddr, aPeerPort))
        {
            if (aOnConnected != nullptr)
            {
                aOnConnected(mDtlsSession, ERROR_IO_ERROR("connect socket to peer addr={}, port={} failed: {}",
                                                          aPeerAddr, aPeerPort, fail));
                ExitNow();
            }
        }
        mDtlsSession.Connect(aOnConnected);

    exit:
        return;
    }